

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::contains(ProString *this,char *s,CaseSensitivity cs)

{
  long lVar1;
  int iVar2;
  undefined4 in_EDX;
  QLatin1String *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  byte bVar3;
  undefined4 in_stack_ffffffffffffffb8;
  ProString *in_stack_ffffffffffffffd0;
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
  QString::QString((QString *)in_RSI,in_stack_ffffffffffffffe0);
  iVar2 = indexOf(in_stack_ffffffffffffffd0,in_RDI,(int)((ulong)in_RSI >> 0x20),
                  (CaseSensitivity)in_RSI);
  bVar3 = -1 < iVar2;
  QString::~QString((QString *)0x13c98c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const char *s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return indexOf(QLatin1String(s), 0, cs) >= 0; }